

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O0

int run_test_pipe_connect_close_multiple(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  int r;
  int i;
  
  loop_00 = uv_default_loop();
  iVar1 = uv_pipe_init(loop_00,&server_handle,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x95,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x98,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&server_handle,0x80,connection_cb2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x9b,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  for (loop._4_4_ = 0; loop._4_4_ < 10; loop._4_4_ = loop._4_4_ + 1) {
    iVar1 = uv_pipe_init(loop_00,&clients[loop._4_4_].pipe_handle,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
              ,0x9f,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    uv_pipe_connect(&clients[loop._4_4_].conn_req,&clients[loop._4_4_].pipe_handle,
                    "/tmp/uv-test-sock",connect_cb2);
  }
  for (loop._4_4_ = 0; loop._4_4_ < 10; loop._4_4_ = loop._4_4_ + 1) {
    uv_close((uv_handle_t *)(clients + loop._4_4_),(uv_close_cb)0x0);
  }
  uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)connection_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0xad,"connection_cb_called","==","10",(long)connection_cb_called,"==",10);
    abort();
  }
  if ((long)connect_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0xae,"connect_cb_called","==","10",(long)connect_cb_called,"==",10);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0xb0,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_connect_close_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb2);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb2);
  }

  for (i = 0; i < NUM_CLIENTS; i++) {
    uv_close((uv_handle_t*)&clients[i].pipe_handle, NULL);
  }


  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}